

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::bufferData
          (ReferenceContext *this,deUint32 target,deIntptr size,void *data,deUint32 usage)

{
  pointer puVar1;
  bool bVar2;
  DataBuffer *pDVar3;
  pointer __dest;
  
  bVar2 = isValidBufferTarget(target);
  if (bVar2) {
    if (size < 0) {
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
    }
    else {
      pDVar3 = getBufferBinding(this,target);
      if (pDVar3 == (DataBuffer *)0x0) {
        if (this->m_lastError == 0) {
          this->m_lastError = 0x502;
        }
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&pDVar3->m_data,(long)(int)size);
        if (data != (void *)0x0) {
          puVar1 = (pDVar3->m_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          __dest = (pointer)0x0;
          if (puVar1 != (pDVar3->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish) {
            __dest = puVar1;
          }
          memcpy(__dest,data,(long)(int)size);
          return;
        }
      }
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bufferData (deUint32 target, deIntptr size, const void* data, deUint32 usage)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(size < 0, GL_INVALID_VALUE, RC_RET_VOID);

	DE_UNREF(usage);

	DataBuffer* buffer = getBufferBinding(target);
	RC_IF_ERROR(!buffer, GL_INVALID_OPERATION, RC_RET_VOID);

	DE_ASSERT((deIntptr)(int)size == size);
	buffer->setStorage((int)size);
	if (data)
		deMemcpy(buffer->getData(), data, (int)size);
}